

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::read_from_file
          (mipmapped_texture *this,char *pFilename,format file_format)

{
  bool bVar1;
  int iVar2;
  data_stream_serializer serializer;
  cfile_stream in_stream;
  data_stream_serializer local_70;
  cfile_stream local_60;
  
  clear(this);
  dynamic_string::set(&this->m_last_error,"Can\'t open file",0xffffffff);
  data_stream::data_stream(&local_60.super_data_stream);
  local_60.super_data_stream._vptr_data_stream = (_func_int **)&PTR__cfile_stream_001cdf30;
  local_60.m_pFile = (FILE *)0x0;
  local_60.m_size._0_1_ = 0;
  local_60.m_size._1_7_ = 0;
  local_60.m_ofs._0_1_ = 0;
  local_60._49_8_ = 0;
  iVar2 = cfile_stream::open(&local_60,pFilename,5,0);
  if ((char)iVar2 == '\0') {
    bVar1 = false;
  }
  else {
    local_70.m_little_endian = true;
    local_70.m_pStream = &local_60.super_data_stream;
    bVar1 = read_from_stream(this,&local_70,file_format);
  }
  cfile_stream::~cfile_stream(&local_60);
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_from_file(const char* pFilename, texture_file_types::format file_format) {
  clear();

  set_last_error("Can't open file");

  bool success = false;

  cfile_stream in_stream;
  if (in_stream.open(pFilename)) {
    data_stream_serializer serializer(in_stream);
    success = read_from_stream(serializer, file_format);
  }

  return success;
}